

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_x509.cc
# Opt level: O2

int i2d_X509_AUX(X509 *a,uchar **pp)

{
  int iVar1;
  uint uVar2;
  uchar *tmp;
  
  if ((pp != (uchar **)0x0) && (*pp == (uchar *)0x0)) {
    uVar2 = i2d_x509_aux_internal((X509 *)a,(uchar **)0x0);
    if (0 < (int)uVar2) {
      tmp = (uchar *)OPENSSL_malloc((ulong)uVar2);
      *pp = tmp;
      if (tmp == (uchar *)0x0) {
        uVar2 = 0xffffffff;
      }
      else {
        uVar2 = i2d_x509_aux_internal((X509 *)a,&tmp);
        if ((int)uVar2 < 1) {
          OPENSSL_free(*pp);
          *pp = (uchar *)0x0;
        }
      }
    }
    return uVar2;
  }
  iVar1 = i2d_x509_aux_internal((X509 *)a,pp);
  return iVar1;
}

Assistant:

int i2d_X509_AUX(X509 *a, unsigned char **pp) {
  int length;
  unsigned char *tmp;

  // Buffer provided by caller
  if (pp == NULL || *pp != NULL) {
    return i2d_x509_aux_internal(a, pp);
  }

  // Obtain the combined length
  if ((length = i2d_x509_aux_internal(a, NULL)) <= 0) {
    return length;
  }

  // Allocate requisite combined storage
  *pp = tmp = reinterpret_cast<uint8_t *>(OPENSSL_malloc(length));
  if (tmp == NULL) {
    return -1;  // Push error onto error stack?
  }

  // Encode, but keep *pp at the originally malloced pointer
  length = i2d_x509_aux_internal(a, &tmp);
  if (length <= 0) {
    OPENSSL_free(*pp);
    *pp = NULL;
  }
  return length;
}